

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals __thiscall Omega_h::matrices_to_symms_dim<1>(Omega_h *this,Reals *matrices)

{
  int size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_c0;
  undefined1 local_b0 [8];
  type functor;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  Write<double> out;
  int n;
  Int ncomps_out;
  int ncomps_in;
  Reals *matrices_local;
  ulong local_10;
  
  if (((ulong)(matrices->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((matrices->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(matrices->write_).shared_alloc_.alloc >> 3;
  }
  size_in = divide_no_remainder<int>((int)(local_10 >> 3),1);
  out.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  Write<double>::Write((Write<double> *)local_58,size_in,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  Write<double>::Write((Write<double> *)local_b0,(Write<double> *)local_58);
  Read<double>::Read((Read<double> *)&functor.out.shared_alloc_.direct_ptr,matrices);
  parallel_for<Omega_h::matrices_to_symms_dim<1>(Omega_h::Read<double>)::_lambda(int)_1_>
            (out.shared_alloc_.direct_ptr._4_4_,(type *)local_b0);
  Write<double>::Write(&local_c0,(Write<double> *)local_58);
  Read<double>::Read((Read<double> *)this,&local_c0);
  Write<double>::~Write(&local_c0);
  matrices_to_symms_dim<1>(Omega_h::Read<double>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_b0);
  Write<double>::~Write((Write<double> *)local_58);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals matrices_to_symms_dim(Reals const matrices) {
  constexpr auto ncomps_in = square(dim);
  constexpr auto ncomps_out = symm_ncomps(dim);
  auto const n = divide_no_remainder(matrices.size(), ncomps_in);
  auto const out = Write<Real>(n * ncomps_out);
  auto functor = OMEGA_H_LAMBDA(LO const i) {
    set_symm(out, i, get_matrix<dim, dim>(matrices, i));
  };
  parallel_for(n, std::move(functor));
  return out;
}